

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

optional<int>
slang::ast::bindArrayIndexSetter
          (ASTContext *context,Expression *keyExpr,Type *elementType,ExpressionSyntax *valueSyntax,
          SmallMap<int,_const_slang::ast::Expression_*,_8UL,_ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>
          *indexMap,
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
          *indexSetters)

{
  bool bVar1;
  SourceLocation location;
  Expression *this;
  Diagnostic *this_00;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  pair<ska::detailv3::sherwood_v3_table<std::pair<int,_const_slang::ast::Expression_*>,_int,_std::hash<int>,_ska::detailv3::KeyOrValueHasher<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::hash<int>_>,_std::equal_to<int>,_ska::detailv3::KeyOrValueEquality<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::equal_to<int>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<int,_const_slang::ast::Expression_*>_>,_bool>
  pVar5;
  optional<int> index;
  _Storage<int,_true> local_50 [2];
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *local_48;
  Token local_40;
  
  local_50 = (_Storage<int,_true>  [2])ASTContext::evalInteger(context,keyExpr);
  if (((ulong)local_50 >> 0x20 & 1) != 0) {
    local_48 = indexSetters;
    local_40 = slang::syntax::SyntaxNode::getFirstToken(&valueSyntax->super_SyntaxNode);
    location = parsing::Token::location(&local_40);
    uVar4 = 0;
    this = Expression::bindRValue
                     (elementType,valueSyntax,location,context,(bitmask<slang::ast::ASTFlags>)0x0);
    bVar1 = Expression::bad(this);
    uVar3 = 0;
    if (bVar1) goto LAB_003ac165;
    local_40._0_8_ = this;
    pVar5 = ska::detailv3::
            sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>
            ::emplace<int&,slang::ast::Expression_const*>
                      ((sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>
                        *)&indexMap->
                           super_flat_hash_map<int,_const_slang::ast::Expression_*,_std::hash<int>,_std::equal_to<int>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>
                       ,&local_50[0]._M_value,(Expression **)&local_40);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar3 = 0x100000000;
      local_40.info = (Info *)this;
      local_40._0_8_ = keyExpr;
      SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::
      emplace_back<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                (local_48,(IndexSetter *)&local_40);
      uVar4 = (ulong)local_50 & 0xffffffff;
      goto LAB_003ac165;
    }
    this_00 = ASTContext::addDiag(context,(DiagCode)0x110007,keyExpr->sourceRange);
    lVar2 = (long)local_50[0]._M_value;
    local_40.kind = (short)lVar2;
    local_40._2_1_ = (char)((ulong)lVar2 >> 0x10);
    local_40.numFlags.raw = (char)((ulong)lVar2 >> 0x18);
    local_40.rawLen = (int)((ulong)lVar2 >> 0x20);
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
    ::emplace_back<long>(&this_00->args,(long *)&local_40);
    Diagnostic::addNote(this_00,(DiagCode)0x80001,
                        (((pVar5.first.current.current)->field_1).value.second)->sourceRange);
  }
  uVar4 = 0;
  uVar3 = 0;
LAB_003ac165:
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)(uVar4 | uVar3);
}

Assistant:

static std::optional<int32_t> bindArrayIndexSetter(
    const ASTContext& context, const Expression& keyExpr, const Type& elementType,
    const ExpressionSyntax& valueSyntax, SmallMap<int32_t, const Expression*, 8>& indexMap,
    SmallVectorBase<StructuredAssignmentPatternExpression::IndexSetter>& indexSetters) {

    std::optional<int32_t> index = context.evalInteger(keyExpr);
    if (!index)
        return std::nullopt;

    auto& expr = Expression::bindRValue(elementType, valueSyntax,
                                        valueSyntax.getFirstToken().location(), context);
    if (expr.bad())
        return std::nullopt;

    auto [it, inserted] = indexMap.emplace(*index, &expr);
    if (!inserted) {
        auto& diag = context.addDiag(diag::AssignmentPatternKeyDupValue, keyExpr.sourceRange);
        diag << *index;
        diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
        return std::nullopt;
    }

    indexSetters.push_back({&keyExpr, &expr});
    return *index;
}